

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::FboTestUtil::TextureCubeArrayShader::shadeFragments
          (TextureCubeArrayShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  DataType DVar1;
  pointer pUVar2;
  GenericVec4 *pGVar3;
  TextureCubeArrayShader *pTVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int fragNdx;
  long lVar8;
  FragmentPacket *packet;
  float *pfVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  Vec4 coord;
  UVec4 uicolor;
  IVec4 icolor;
  Vec4 colors [4];
  Vec4 texCoords [4];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  ulong local_120;
  TextureCubeArrayShader *local_118;
  FragmentPacket *local_110;
  TextureCubeArray *local_108;
  ulong local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  Vec4 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Vec4 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pUVar2 = (this->super_ShaderProgram).m_uniforms.
           super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_e8 = *(undefined8 *)&pUVar2[2].value;
  uStack_e0 = *(undefined8 *)((long)&pUVar2[2].value + 8);
  local_f8 = *(undefined8 *)&pUVar2[3].value;
  uStack_f0 = *(undefined8 *)((long)&pUVar2[3].value + 8);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78.m_data[0] = 0.0;
  local_78.m_data[1] = 0.0;
  local_78.m_data[2] = 0.0;
  local_78.m_data[3] = 0.0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8.m_data[0] = 0.0;
  local_b8.m_data[1] = 0.0;
  local_b8.m_data[2] = 0.0;
  local_b8.m_data[3] = 0.0;
  if (0 < numPackets) {
    local_120 = (ulong)(uint)numPackets;
    iVar5 = 0;
    local_100 = 0;
    local_118 = this;
    local_110 = packets;
    do {
      pTVar4 = local_118;
      local_108 = (local_118->super_ShaderProgram).m_uniforms.
                  super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
                  super__Vector_impl_data._M_start[1].sampler.texCubeArray;
      packet = local_110 + local_100;
      pfVar9 = local_78.m_data + 3;
      lVar8 = 0;
      do {
        rr::readTriangleVarying<float>((rr *)&local_138,packet,context,0,(int)lVar8);
        iVar7 = pTVar4->m_layer;
        *(ulong *)((Vec4 *)(pfVar9 + -3))->m_data = CONCAT44(fStack_134,local_138);
        pfVar9[-1] = fStack_130;
        *pfVar9 = (float)iVar7;
        lVar8 = lVar8 + 1;
        pfVar9 = pfVar9 + 4;
      } while (lVar8 != 4);
      sglr::rc::TextureCubeArray::sample4(local_108,&local_b8,&local_78,0.0);
      DVar1 = pTVar4->m_outputType;
      pGVar3 = context->outputArray;
      lVar8 = 0;
      iVar7 = iVar5;
      do {
        local_138 = *(float *)((long)local_b8.m_data + lVar8) * (float)local_e8 + (float)local_f8;
        fStack_134 = *(float *)((long)local_b8.m_data + lVar8 + 4) * local_e8._4_4_ + local_f8._4_4_
        ;
        fStack_130 = *(float *)((long)local_b8.m_data + lVar8 + 8) * (float)uStack_e0 +
                     (float)uStack_f0;
        fStack_12c = *(float *)((long)local_b8.m_data + lVar8 + 0xc) * uStack_e0._4_4_ +
                     uStack_f0._4_4_;
        castVectorSaturate<int>((Vec4 *)&local_138);
        castVectorSaturate<unsigned_int>((Vec4 *)&local_138);
        if (DVar1 == TYPE_UINT_VEC4) {
          lVar6 = (long)(context->numFragmentOutputs * iVar7) << 4;
          fVar10 = local_d8;
          fVar11 = fStack_d4;
          fVar12 = fStack_d0;
          fVar13 = fStack_cc;
LAB_014d0d60:
          pfVar9 = (float *)((long)&pGVar3->v + lVar6);
          *pfVar9 = fVar10;
          pfVar9[1] = fVar11;
          pfVar9[2] = fVar12;
          pfVar9[3] = fVar13;
        }
        else {
          if (DVar1 == TYPE_INT_VEC4) {
            lVar6 = (long)(context->numFragmentOutputs * iVar7) << 4;
            fVar10 = local_c8;
            fVar11 = fStack_c4;
            fVar12 = fStack_c0;
            fVar13 = fStack_bc;
            goto LAB_014d0d60;
          }
          if (DVar1 == TYPE_FLOAT_VEC4) {
            lVar6 = (long)(context->numFragmentOutputs * iVar7) << 4;
            fVar10 = local_138;
            fVar11 = fStack_134;
            fVar12 = fStack_130;
            fVar13 = fStack_12c;
            goto LAB_014d0d60;
          }
        }
        lVar8 = lVar8 + 0x10;
        iVar7 = iVar7 + 1;
      } while (lVar8 != 0x40);
      local_100 = local_100 + 1;
      iVar5 = iVar5 + 4;
    } while (local_100 != local_120);
  }
  return;
}

Assistant:

void TextureCubeArrayShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4 texScale (m_uniforms[2].value.f4);
	const tcu::Vec4 texBias	 (m_uniforms[3].value.f4);

	tcu::Vec4 texCoords[4];
	tcu::Vec4 colors[4];

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const sglr::rc::TextureCubeArray* tex = m_uniforms[1].sampler.texCubeArray;

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4	coord = rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
			texCoords[fragNdx] = tcu::Vec4(coord.x(), coord.y(), coord.z(), (float)m_layer);
		}

		tex->sample4(colors, texCoords);

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4		color	= colors[fragNdx] * texScale + texBias;
			const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
			const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

			if (m_outputType == glu::TYPE_FLOAT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
			else if (m_outputType == glu::TYPE_INT_VEC4)	rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
			else if (m_outputType == glu::TYPE_UINT_VEC4)	rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
			else
				DE_ASSERT(DE_FALSE);
		}
	}
}